

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sampler_ycbcr_conversion
          (Impl *this,Value *state,VkSamplerYcbcrConversionCreateInfo **out_info)

{
  VkFormat VVar1;
  VkSamplerYcbcrModelConversion VVar2;
  VkSamplerYcbcrRange VVar3;
  VkComponentSwizzle VVar4;
  VkChromaLocation VVar5;
  VkFilter VVar6;
  uint uVar7;
  VkSamplerYcbcrConversionCreateInfo *pVVar8;
  Type pGVar9;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar10;
  VkSamplerYcbcrConversionCreateInfo *info;
  VkSamplerYcbcrConversionCreateInfo **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar8 = ScratchAllocator::allocate_cleared<VkSamplerYcbcrConversionCreateInfo>(&this->allocator);
  *out_info = pVVar8;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"format");
  VVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar9);
  pVVar8->format = VVar1;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"ycbcrModel");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar9);
  pVVar8->ycbcrModel = VVar2;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"ycbcrRange");
  VVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar9);
  pVVar8->ycbcrRange = VVar3;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"components");
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator[](pGVar9,0);
  VVar4 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar10);
  (pVVar8->components).r = VVar4;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"components");
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator[](pGVar9,1);
  VVar4 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar10);
  (pVVar8->components).g = VVar4;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"components");
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator[](pGVar9,2);
  VVar4 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar10);
  (pVVar8->components).b = VVar4;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"components");
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator[](pGVar9,3);
  VVar4 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar10);
  (pVVar8->components).a = VVar4;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"xChromaOffset");
  VVar5 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar9);
  pVVar8->xChromaOffset = VVar5;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"yChromaOffset");
  VVar5 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar9);
  pVVar8->yChromaOffset = VVar5;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"chromaFilter");
  VVar6 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar9);
  pVVar8->chromaFilter = VVar6;
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"forceExplicitReconstruction");
  uVar7 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar9);
  pVVar8->forceExplicitReconstruction = uVar7;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_sampler_ycbcr_conversion(const Value &state,
                                                         VkSamplerYcbcrConversionCreateInfo **out_info)
{
	auto *info = allocator.allocate_cleared<VkSamplerYcbcrConversionCreateInfo>();
	*out_info = info;

	info->format = static_cast<VkFormat>(state["format"].GetUint());
	info->ycbcrModel = static_cast<VkSamplerYcbcrModelConversion>(state["ycbcrModel"].GetUint());
	info->ycbcrRange = static_cast<VkSamplerYcbcrRange>(state["ycbcrRange"].GetUint());
	info->components.r = static_cast<VkComponentSwizzle>(state["components"][0].GetUint());
	info->components.g = static_cast<VkComponentSwizzle>(state["components"][1].GetUint());
	info->components.b = static_cast<VkComponentSwizzle>(state["components"][2].GetUint());
	info->components.a = static_cast<VkComponentSwizzle>(state["components"][3].GetUint());
	info->xChromaOffset = static_cast<VkChromaLocation>(state["xChromaOffset"].GetUint());
	info->yChromaOffset = static_cast<VkChromaLocation>(state["yChromaOffset"].GetUint());
	info->chromaFilter = static_cast<VkFilter>(state["chromaFilter"].GetUint());
	info->forceExplicitReconstruction = state["forceExplicitReconstruction"].GetUint();

	return true;
}